

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Production.cpp
# Opt level: O2

Production * __thiscall
SGParser::Generator::Production::operator=(Production *this,Production *source)

{
  uint *puVar1;
  uint *puVar2;
  
  puVar1 = this->pRight;
  puVar2 = source->pRight;
  if (puVar1 != puVar2) {
    if ((puVar1 != (uint *)0x0) && (*puVar1 = *puVar1 - 1, *puVar1 == 0)) {
      operator_delete__(puVar1);
      puVar2 = source->pRight;
    }
    this->pRight = puVar2;
    if (puVar2 != (uint *)0x0) {
      *puVar2 = *puVar2 + 1;
    }
  }
  std::__cxx11::string::_M_assign((string *)this);
  this->Id = source->Id;
  this->Precedence = source->Precedence;
  this->Left = source->Left;
  this->Length = source->Length;
  this->Line = source->Line;
  this->NotReported = source->NotReported;
  this->ErrorTerminal = source->ErrorTerminal;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->LeftChain,&source->LeftChain);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  ::operator=(&(this->ReduceOverrides)._M_t,&(source->ReduceOverrides)._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction>,_std::_Select1st<std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction>_>_>
  ::operator=(&(this->ConflictActions)._M_t,&(source->ConflictActions)._M_t);
  return this;
}

Assistant:

Production& Production::operator=(const Production& source) {
    // Destroy previous pRight, assign new one
    if (pRight != source.pRight) {
        if (pRight)
            if (!(--pRight[0u]))
                delete[] pRight;

        if (pRight = source.pRight; pRight != nullptr)
            ++pRight[0u];
    }

    Name            = source.Name;
    Id              = source.Id;
    Precedence      = source.Precedence;
    Left            = source.Left;
    Length          = source.Length;
    Line            = source.Line;
    NotReported     = source.NotReported;
    ErrorTerminal   = source.ErrorTerminal;
    LeftChain       = source.LeftChain;
    ReduceOverrides = source.ReduceOverrides;
    ConflictActions = source.ConflictActions;

    return *this;
}